

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle1.cpp
# Opt level: O3

void __thiscall
OpenMD::ContactAngle1::ContactAngle1
          (ContactAngle1 *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          RealType solidZ,RealType dropletRadius)

{
  long *plVar1;
  ostream *poVar2;
  long *plVar3;
  string paramString;
  stringstream params;
  string local_1d0;
  RealType local_1b0;
  RealType local_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  ios_base local_120 [264];
  
  local_1b0 = solidZ;
  local_1a8 = dropletRadius;
  SequentialAnalyzer::SequentialAnalyzer(&this->super_SequentialAnalyzer,info,filename,sele1,sele2);
  (this->super_SequentialAnalyzer)._vptr_SequentialAnalyzer =
       (_func_int **)&PTR__SequentialAnalyzer_0024d970;
  this->solidZ_ = local_1b0;
  this->dropletRadius_ = local_1a8;
  getPrefix(&local_1d0,filename);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_190 = *plVar3;
    lStack_188 = plVar1[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar3;
    local_1a0 = (long *)*plVar1;
  }
  local_198 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).outputFilename_);
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190," solid Z = ",0xb);
  poVar2 = std::ostream::_M_insert<double>(this->solidZ_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", droplet radius = ",0x13);
  std::ostream::_M_insert<double>(this->dropletRadius_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_SequentialAnalyzer).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

ContactAngle1::ContactAngle1(SimInfo* info, const std::string& filename,
                               const std::string& sele1,
                               const std::string& sele2, RealType solidZ,
                               RealType dropletRadius) :
      SequentialAnalyzer(info, filename, sele1, sele2),
      solidZ_(solidZ), dropletRadius_(dropletRadius) {
    setOutputName(getPrefix(filename) + ".ca1");

    std::stringstream params;
    params << " solid Z = " << solidZ_
           << ", droplet radius = " << dropletRadius_;

    const std::string paramString = params.str();
    setParameterString(paramString);
  }